

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::coding_stats::update
          (coding_stats *this,lzdecision *lzdec,state *cur_state,search_accelerator *dict,
          bit_cost_t cost)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bit_cost_t bVar6;
  search_accelerator *in_RCX;
  long in_RDX;
  lzdecision *in_RSI;
  int *in_RDI;
  ulong in_R8;
  float fVar7;
  double dVar8;
  float fVar9;
  int match_hist_index;
  float match_bit_cost_1;
  uint type_index;
  uint actual_match_len;
  uint cur_lookahead_size;
  uint match_dist;
  uint match_len;
  float match_bit_cost;
  uint is_match_model_index;
  float cost_in_bits;
  int local_94;
  state *in_stack_ffffffffffffff70;
  int *piVar10;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float local_80;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  float fVar11;
  uint local_48;
  
  uVar3 = lzdecision::get_len((lzdecision *)0x11ad63);
  *in_RDI = *in_RDI + uVar3;
  in_RDI[1] = in_RDI[1] + 1;
  fVar9 = (float)(long)in_R8;
  fVar11 = (float)in_R8;
  fVar7 = fVar11 / 16777216.0;
  *(double *)(in_RDI + 2) = (double)fVar7 + *(double *)(in_RDI + 2);
  tracked_stat::update((tracked_stat *)(in_RDI + 4),(double)fVar7);
  uVar1 = *(uint *)(in_RDX + 4);
  if (in_RSI->m_len == 0) {
    bVar6 = adaptive_bit_model::get_cost((adaptive_bit_model *)(in_RDX + 0x24 + (ulong)uVar1 * 2),0)
    ;
    fVar9 = (float)bVar6 / 16777216.0;
    *(double *)(in_RDI + 0x12) = (double)fVar9 + *(double *)(in_RDI + 0x12);
    *(double *)(in_RDI + 0xe) = (double)fVar9 + *(double *)(in_RDI + 0xe);
    dVar8 = math::maximum<double>(*(double *)(in_RDI + 0x10),(double)fVar9);
    *(double *)(in_RDI + 0x10) = dVar8;
    in_RDI[0x293] = in_RDI[0x293] + 1;
    if (*(uint *)(in_RDX + 4) < 7) {
      tracked_stat::update((tracked_stat *)(in_RDI + 0x296),(double)fVar7);
    }
    else {
      tracked_stat::update((tracked_stat *)(in_RDI + 0x2a0),(double)fVar7);
    }
  }
  else if (in_RSI->m_len < 0x102) {
    uVar3 = lzdecision::get_len((lzdecision *)0x11af4b);
    lzdecision::get_match_dist
              ((lzdecision *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70);
    search_accelerator::get_lookahead_size(in_RCX);
    uVar4 = search_accelerator::get_match_len
                      ((search_accelerator *)CONCAT44(fVar11,fVar9),(uint)((ulong)in_RDI >> 0x20),
                       (int)in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    if (uVar4 < uVar3) {
      lzham_assert("match_len <= actual_match_len",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_lzcomp_state.cpp"
                   ,0x64d);
    }
    in_RDI[0x16] = (uint)(uVar3 < uVar4) + in_RDI[0x16];
    iVar5 = math::maximum<int>(0,uVar4 - uVar3);
    in_RDI[(long)iVar5 + 0x17] = in_RDI[(long)iVar5 + 0x17] + 1;
    local_48 = 4;
    bVar2 = lzdecision::is_full_match(in_RSI);
    if (!bVar2) {
      local_48 = 0xffffffff - in_RSI->m_dist;
    }
    if (uVar3 < uVar4) {
      in_RDI[(ulong)uVar3 + 0x119] = in_RDI[(ulong)uVar3 + 0x119] + 1;
      in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_48 + 0x21b] =
           in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_48 + 0x21b] + 1;
    }
    else {
      in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_48 + 599] =
           in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_48 + 599] + 1;
    }
    bVar6 = adaptive_bit_model::get_cost((adaptive_bit_model *)(in_RDX + 0x24 + (ulong)uVar1 * 2),1)
    ;
    local_80 = (float)bVar6;
    local_80 = local_80 / 16777216.0;
    *(double *)(in_RDI + 0x14) = (double)local_80 + *(double *)(in_RDI + 0x14);
    *(double *)(in_RDI + 0xe) = (double)local_80 + *(double *)(in_RDI + 0xe);
    dVar8 = math::maximum<double>(*(double *)(in_RDI + 0x10),(double)local_80);
    *(double *)(in_RDI + 0x10) = dVar8;
    in_RDI[0x294] = in_RDI[0x294] + 1;
    if (in_RSI->m_dist < 0) {
      iVar5 = -1 - in_RSI->m_dist;
      tracked_stat::update((tracked_stat *)(in_RDI + (long)iVar5 * 10 + 0x2aa),(double)fVar7);
      if (iVar5 == 0) {
        if (in_RSI->m_len == 1) {
          tracked_stat::update((tracked_stat *)(in_RDI + 0x2d2),(double)fVar7);
        }
        else {
          tracked_stat::update((tracked_stat *)(in_RDI + 0x2dc),(double)fVar7);
        }
      }
    }
    else {
      piVar10 = in_RDI + 0x2e6;
      iVar5 = math::minimum<int>(0x101,uVar3);
      tracked_stat::update((tracked_stat *)(piVar10 + (long)iVar5 * 10),(double)fVar7);
      if (uVar3 == 2) {
        if (in_RSI->m_dist < 0x201) {
          in_RDI[0xcfb] = in_RDI[0xcfb] + 1;
        }
        else {
          in_RDI[0xcfa] = in_RDI[0xcfa] + 1;
        }
        if (in_RDI[0xcfd] < in_RSI->m_dist) {
          local_94 = in_RSI->m_dist;
        }
        else {
          local_94 = in_RDI[0xcfd];
        }
        in_RDI[0xcfd] = local_94;
      }
    }
  }
  return;
}

Assistant:

void lzcompressor::coding_stats::update(const lzdecision& lzdec, const state& cur_state, const search_accelerator& dict, bit_cost_t cost)
   {
      m_total_bytes += lzdec.get_len();
      m_total_contexts++;

      float cost_in_bits = cost / (float)cBitCostScale;
      LZHAM_ASSERT(cost_in_bits > 0.0f);
      m_total_cost += cost_in_bits;

      m_context_stats.update(cost_in_bits);

      //uint match_pred = cur_state.get_pred_char(dict, lzdec.m_pos, 1);
      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(cur_state.m_cur_state);

      if (lzdec.m_len == 0)
      {
         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(0) / (float)cBitCostScale;

         m_total_is_match0_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_nonmatches++;

         if (cur_state.m_cur_state < CLZBase::cNumLitStates)
         {
            m_lit_stats.update(cost_in_bits);
         }
         else
         {
            m_delta_lit_stats.update(cost_in_bits);
         }
      }
      else if (lzdec.m_len <= CLZBase::cMaxMatchLen)
      {
         const uint match_len = lzdec.get_len();

         {
            uint match_dist = lzdec.get_match_dist(cur_state);

            uint cur_lookahead_size = dict.get_lookahead_size();

            uint actual_match_len = dict.get_match_len(0, match_dist, LZHAM_MIN(cur_lookahead_size, static_cast<uint>(CLZBase::cMaxMatchLen)));
            LZHAM_VERIFY(match_len <= actual_match_len);

            m_total_truncated_matches += match_len < actual_match_len;
            m_match_truncation_len_hist[math::maximum<int>(0, actual_match_len - match_len)]++;

            uint type_index = 4;
            if (!lzdec.is_full_match())
            {
               LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
               type_index = -lzdec.m_dist - 1;
            }

            if (actual_match_len > match_len)
            {
               m_match_truncation_hist[match_len]++;

               m_match_type_truncation_hist[cur_state.m_cur_state][type_index]++;
            }
            else
            {
               m_match_type_was_not_truncated_hist[cur_state.m_cur_state][type_index]++;
            }
         }

         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(1) / (float)cBitCostScale;
         m_total_is_match1_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_matches++;

         if (lzdec.m_dist < 0)
         {
            // rep match
            int match_hist_index = -lzdec.m_dist - 1;
            LZHAM_ASSERT(match_hist_index < CLZBase::cMatchHistSize);

            m_rep_stats[match_hist_index].update(cost_in_bits);

            if (!match_hist_index)
            {
               // rep0 match
               if (lzdec.m_len == 1)
               {
                  m_rep0_len1_stats.update(cost_in_bits);
               }
               else
               {
                  m_rep0_len2_plus_stats.update(cost_in_bits);
               }
            }
         }
         else
         {
            m_full_match_stats[math::minimum<int>(cMaxMatchLen, match_len)].update(cost_in_bits);

            if (match_len == 2)
            {
               if (lzdec.m_dist <= 512)
                  m_total_near_len2_matches++;
               else
                  m_total_far_len2_matches++;

               m_max_len2_dist = LZHAM_MAX((int)m_max_len2_dist, lzdec.m_dist);
            }
         }
      }
      else
      {
         // TODO: Handle huge matches.
      }
   }